

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.h
# Opt level: O1

void __thiscall
Js::DataView::SetValue<int,int*>
          (DataView *this,Var offset,int value,BOOL isLittleEndian,char16 *funcName)

{
  ScriptContext *scriptContext;
  uint32 uVar1;
  uint uVar2;
  
  scriptContext =
       (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  uVar2 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  if (uVar2 < 4) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec1f,funcName);
  }
  uVar1 = ArrayBuffer::ToIndex(offset,-0x7ff5ec1f,scriptContext,uVar2 - 4,false);
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached != true) {
    uVar2 = (uint)value >> 0x18 | (value & 0xff0000U) >> 8 | (value & 0xff00U) << 8 | value << 0x18;
    if (isLittleEndian != 0) {
      uVar2 = value;
    }
    *(uint *)((this->buffer).ptr + uVar1) = uVar2;
    return;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,funcName);
}

Assistant:

void SetValue(Var offset, TypeName value, BOOL isLittleEndian, const char16 *funcName)
        {
            ScriptContext* scriptContext = GetScriptContext();

            uint32 length = GetLength();
            if (length < sizeof(TypeName))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_DataView_InvalidOffset, funcName);
            }

            uint32 byteOffset = ArrayBuffer::ToIndex(offset, JSERR_DataView_InvalidOffset, scriptContext, length - sizeof(TypeName), false);
            if (this->GetArrayBuffer()->IsDetached())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, funcName);
            }

            TypeName* typedBuffer = (TypeName*)(buffer + byteOffset);
            if (!isLittleEndian)
            {
                SwapRoutine<TypeName>(&value, typedBuffer);
            }
            else
            {
                *static_cast<PointerAccessTypeName>(typedBuffer) = value;
            }
        }